

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::makeUnknown(SVInt *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  uint32_t uVar3;
  void *pvVar4;
  size_t __n;
  long *in_RDI;
  uint64_t *newMem;
  uint64_t value;
  uint32_t words;
  
  if ((*(byte *)((long)in_RDI + 0xd) & 1) == 0) {
    uVar3 = getNumWords((SVInt *)0xbb5af8);
    *(undefined1 *)((long)in_RDI + 0xd) = 1;
    if (uVar3 == 1) {
      lVar1 = *in_RDI;
      pvVar4 = operator_new__(0xbb5b25);
      *in_RDI = (long)pvVar4;
      *(long *)*in_RDI = lVar1;
      *(undefined8 *)(*in_RDI + 8) = 0;
    }
    else {
      auVar2 = ZEXT416(uVar3 << 1) * ZEXT816(8);
      __n = auVar2._0_8_;
      if (auVar2._8_8_ != 0) {
        __n = 0xffffffffffffffff;
      }
      pvVar4 = operator_new__(0xbb5b79);
      memset(pvVar4,0,__n);
      memcpy(pvVar4,(void *)*in_RDI,(ulong)(uVar3 << 3));
      if (*in_RDI != 0) {
        operator_delete__((void *)0xbb5bd1);
      }
      *in_RDI = (long)pvVar4;
    }
  }
  return;
}

Assistant:

void SVInt::makeUnknown() {
    if (unknownFlag)
        return;

    uint32_t words = getNumWords();
    unknownFlag = true;
    if (words == 1) {
        auto value = val;
        pVal = new uint64_t[2];
        pVal[0] = value;
        pVal[1] = 0;
    }
    else {
        uint64_t* newMem = new uint64_t[words * 2]();
        memcpy(newMem, pVal, words * WORD_SIZE);
        delete[] pVal;
        pVal = newMem;
    }
}